

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

bool spvtools::utils::
     RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
               (istream *is,bool negate_value,
               HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
               *value)

{
  FloatProxy<float> local_34;
  FloatProxy<float> local_30;
  int local_2c;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *pHStack_28;
  int_type next_char;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *value_local;
  istream *piStack_18;
  bool negate_value_local;
  istream *is_local;
  
  if ((negate_value) &&
     ((pHStack_28 = value, value_local._7_1_ = negate_value, piStack_18 = is,
      local_2c = std::istream::peek(), local_2c == 0x2d || (local_2c == 0x2b)))) {
    FloatProxy<float>::FloatProxy(&local_34,0);
    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
    ::HexFloat((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                *)&local_30,local_34);
    (pHStack_28->value_).data_ = local_30.data_;
    std::ios::setstate((int)piStack_18 + (int)*(undefined8 *)(*(long *)piStack_18 + -0x18));
    is_local._7_1_ = true;
  }
  else {
    is_local._7_1_ = false;
  }
  return is_local._7_1_;
}

Assistant:

inline bool RejectParseDueToLeadingSign(std::istream& is, bool negate_value,
                                        HexFloat<T, Traits>& value) {
  if (negate_value) {
    auto next_char = is.peek();
    if (next_char == '-' || next_char == '+') {
      // Fail the parse.  Emulate standard behaviour by setting the value to
      // the zero value, and set the fail bit on the stream.
      value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
      is.setstate(std::ios_base::failbit);
      return true;
    }
  }
  return false;
}